

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O3

FDynamicColormap * GetSpecialLights(PalEntry color,PalEntry fade,int desaturate)

{
  int iVar1;
  BYTE *pBVar2;
  FDynamicColormap *pFVar3;
  
  pFVar3 = &NormalLight;
  while ((((anon_union_4_2_12391d7c_for_PalEntry_0)(pFVar3->Color).field_0.d != color.field_0 ||
          ((anon_union_4_2_12391d7c_for_PalEntry_0)(pFVar3->Fade).field_0.d != fade.field_0)) ||
         (pFVar3->Desaturate != desaturate))) {
    pFVar3 = pFVar3->Next;
    if (pFVar3 == (FDynamicColormap *)0x0) {
      pFVar3 = (FDynamicColormap *)operator_new(0x20);
      pFVar3->Next = NormalLight.Next;
      (pFVar3->Color).field_0.field_0 =
           (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)color.field_0;
      (pFVar3->Fade).field_0.field_0 =
           (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)fade.field_0;
      pFVar3->Desaturate = desaturate;
      NormalLight.Next = pFVar3;
      iVar1 = (*Renderer->_vptr_FRenderer[2])();
      if ((char)iVar1 == '\0') {
        pFVar3->Maps = (BYTE *)0x0;
      }
      else {
        pBVar2 = (BYTE *)operator_new__(0x2000);
        pFVar3->Maps = pBVar2;
        FDynamicColormap::BuildLights(pFVar3);
      }
      return pFVar3;
    }
  }
  return pFVar3;
}

Assistant:

FDynamicColormap *GetSpecialLights (PalEntry color, PalEntry fade, int desaturate)
{
	FDynamicColormap *colormap;

	// If this colormap has already been created, just return it
	for (colormap = &NormalLight; colormap != NULL; colormap = colormap->Next)
	{
		if (color == colormap->Color &&
			fade == colormap->Fade &&
			desaturate == colormap->Desaturate)
		{
			return colormap;
		}
	}

	// Not found. Create it.
	colormap = new FDynamicColormap;
	colormap->Next = NormalLight.Next;
	colormap->Color = color;
	colormap->Fade = fade;
	colormap->Desaturate = desaturate;
	NormalLight.Next = colormap;

	if (Renderer->UsesColormap())
	{
		colormap->Maps = new BYTE[NUMCOLORMAPS*256];
		colormap->BuildLights ();
	}
	else colormap->Maps = NULL;

	return colormap;
}